

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermSymbol * __thiscall
glslang::TIntermediate::addSymbol(TIntermediate *this,TType *type,TSourceLoc *loc)

{
  TIntermSymbol *pTVar1;
  char *__end;
  TConstUnionArray unionArray;
  TString local_80;
  TString local_58;
  
  unionArray._vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_00af64b8;
  unionArray.unionArray = (TConstUnionVector *)0x0;
  local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,""
             ,"");
  local_80._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_80,""
             ,"");
  pTVar1 = addSymbol(this,0,&local_58,&local_80,type,&unionArray,(TIntermTyped *)0x0,loc);
  return pTVar1;
}

Assistant:

TIntermSymbol* TIntermediate::addSymbol(const TType& type, const TSourceLoc& loc)
{
    TConstUnionArray unionArray;  // just a null constant

    return addSymbol(0, "", "", type, unionArray, nullptr, loc);
}